

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall t_java_generator::~t_java_generator(t_java_generator *this)

{
  t_java_generator *this_local;
  
  ~t_java_generator(this);
  operator_delete(this);
  return;
}

Assistant:

t_java_generator(t_program* program,
                   const std::map<std::string, std::string>& parsed_options,
                   const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    bean_style_ = false;
    android_style_ = false;
    private_members_ = false;
    nocamel_style_ = false;
    fullcamel_style_ = false;
    android_legacy_ = false;
    sorted_containers_ = false;
    java5_ = false;
    reuse_objects_ = false;
    use_option_type_ = false;
    undated_generated_annotations_  = false;
    suppress_generated_annotations_ = false;
    rethrow_unhandled_exceptions_ = false;
    unsafe_binaries_ = false;
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("beans") == 0) {
        bean_style_ = true;
      } else if( iter->first.compare("android") == 0) {
        android_style_ = true;
      } else if( iter->first.compare("private-members") == 0) {
        private_members_ = true;
      } else if( iter->first.compare("nocamel") == 0) {
        nocamel_style_ = true;
      } else if( iter->first.compare("fullcamel") == 0) {
        fullcamel_style_ = true;
      } else if( iter->first.compare("android_legacy") == 0) {
        android_legacy_ = true;
      } else if( iter->first.compare("sorted_containers") == 0) {
        sorted_containers_ = true;
      } else if( iter->first.compare("java5") == 0) {
        java5_ = true;
      } else if( iter->first.compare("reuse-objects") == 0) {
        reuse_objects_ = true;
      } else if( iter->first.compare("option_type") == 0) {
        use_option_type_ = true;
      } else if( iter->first.compare("rethrow_unhandled_exceptions") == 0) {
        rethrow_unhandled_exceptions_ = true;
      } else if( iter->first.compare("generated_annotations") == 0) {
        if( iter->second.compare("undated") == 0) {
          undated_generated_annotations_  = true;
        } else if(iter->second.compare("suppress") == 0) {
          suppress_generated_annotations_ = true;
        } else {
          throw "unknown option java:" + iter->first + "=" + iter->second;
        }
      } else if( iter->first.compare("unsafe_binaries") == 0) {
        unsafe_binaries_ = true;
      } else {
        throw "unknown option java:" + iter->first;
      }
    }

    if (java5_) {
      android_legacy_ = true;
    }

    out_dir_base_ = (bean_style_ ? "gen-javabean" : "gen-java");
  }